

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O3

FIOBJ fiobj_hash_get2(FIOBJ hash,uint64_t key_hash)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (((uint)hash & 7) != 4) {
    __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                  ,0x138,"FIOBJ fiobj_hash_get2(const FIOBJ, uint64_t)");
  }
  uVar5 = hash & 0xfffffffffffffff8;
  lVar4 = *(long *)(uVar5 + 0x28);
  if (lVar4 != 0) {
    uVar9 = -(ulong)(key_hash == 0) | key_hash;
    if ((*(char *)(uVar5 + 0x30) != '\0') && (*(long *)(uVar5 + 0x18) != *(long *)(uVar5 + 8))) {
      fio_hash___rehash((fio_hash___s *)(uVar5 + 8));
      lVar4 = *(long *)(uVar5 + 0x28);
    }
    bVar1 = *(byte *)(uVar5 + 0x31);
    uVar7 = 0;
    if (bVar1 != 0) {
      uVar7 = uVar9;
    }
    uVar6 = ~(-1L << (bVar1 & 0x3f));
    uVar7 = uVar7 ^ (uVar9 >> (bVar1 & 0x3f) | uVar9 << 0x40 - (bVar1 & 0x3f));
    uVar3 = uVar7 & uVar6;
    uVar8 = *(ulong *)(lVar4 + uVar3 * 0x10);
    if (uVar8 != uVar9 && uVar8 != 0) {
      uVar8 = 0x420;
      if (*(ulong *)(uVar5 + 0x10) < 0x181) {
        uVar8 = (*(ulong *)(uVar5 + 0x10) >> 2) * 0xb;
      }
      if (uVar8 == 0) {
        return 0;
      }
      uVar5 = 0;
      while( true ) {
        uVar3 = uVar7 + 0xb + uVar5 & uVar6;
        uVar2 = *(ulong *)(lVar4 + uVar3 * 0x10);
        if ((uVar2 == 0) || (uVar2 == uVar9)) break;
        uVar5 = uVar5 + 0xb;
        if (uVar8 <= uVar5) {
          return 0;
        }
      }
    }
    lVar4 = *(long *)(lVar4 + 8 + uVar3 * 0x10);
    if (lVar4 != 0) {
      return *(FIOBJ *)(lVar4 + 0x10);
    }
  }
  return 0;
}

Assistant:

FIOBJ fiobj_hash_get2(const FIOBJ hash, uint64_t key_hash) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  return fio_hash___find(&obj2hash(hash)->hash, key_hash, -1);
  ;
}